

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O3

int link_detach(LINK_HANDLE link,_Bool close,char *error_condition,char *error_description,
               AMQP_VALUE info)

{
  int iVar1;
  ERROR_HANDLE error;
  LOGGER_LOG p_Var2;
  ON_LINK_STATE_CHANGED p_Var3;
  int iVar4;
  LINK_STATE LVar5;
  LINK_STATE LVar6;
  void *pvVar7;
  char *pcVar8;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4cf;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "link_detach",0x4ce,1,"NULL link");
    return 0x4cf;
  }
  if (link->is_closed != false) {
    return 0;
  }
  iVar4 = 0;
  if (error_condition == (char *)0x0) {
LAB_001113c0:
    error = (ERROR_HANDLE)0x0;
  }
  else {
    error = error_create(error_condition);
    if (error == (ERROR_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001113c0;
      pcVar8 = "Cannot create error for detach, detaching without error anyhow";
      error = (ERROR_HANDLE)0x0;
      iVar1 = 0x4de;
    }
    else {
      if (((error_description != (char *)0x0) &&
          (iVar1 = error_set_description(error,error_description), iVar1 != 0)) &&
         (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
        (*p_Var2)(AZ_LOG_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                  ,"link_detach",0x4e6,1,
                  "Cannot set error description on detach error, detaching anyhow");
      }
      if (((info == (AMQP_VALUE)0x0) || (iVar1 = error_set_info(error,info), iVar1 == 0)) ||
         (p_Var2 = xlogging_get_log_function(), p_Var2 == (LOGGER_LOG)0x0)) goto LAB_001113c3;
      pcVar8 = "Cannot set info map on detach error, detaching anyhow";
      iVar1 = 0x4ee;
    }
    (*p_Var2)(AZ_LOG_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
              "link_detach",iVar1,1,pcVar8);
  }
LAB_001113c3:
  LVar5 = link->link_state;
  if (LVar5 - LINK_STATE_HALF_ATTACHED_ATTACH_SENT < 2) {
    iVar1 = send_detach(link,close,error);
    if (iVar1 == 0) {
      LVar5 = link->link_state;
      link->previous_link_state = LVar5;
      link->link_state = LINK_STATE_DETACHED;
      p_Var3 = link->on_link_state_changed;
      iVar1 = iVar4;
      if (p_Var3 == (ON_LINK_STATE_CHANGED)0x0) goto LAB_001114c9;
      pvVar7 = link->callback_context;
      LVar6 = LINK_STATE_DETACHED;
LAB_001114c7:
      (*p_Var3)(pvVar7,LVar6,LVar5);
      iVar1 = iVar4;
      goto LAB_001114c9;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x500;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001114c9;
    iVar4 = 0x4ff;
  }
  else {
    iVar1 = 0;
    if (LVar5 == LINK_STATE_DETACHED) goto LAB_001114c9;
    if (LVar5 != LINK_STATE_ATTACHED) {
      iVar1 = 0x51f;
      goto LAB_001114c9;
    }
    iVar1 = send_detach(link,close,error);
    if (iVar1 == 0) {
      LVar5 = link->link_state;
      link->previous_link_state = LVar5;
      link->link_state = LINK_STATE_HALF_ATTACHED_ATTACH_SENT;
      p_Var3 = link->on_link_state_changed;
      iVar1 = iVar4;
      if (p_Var3 == (ON_LINK_STATE_CHANGED)0x0) goto LAB_001114c9;
      pvVar7 = link->callback_context;
      LVar6 = LINK_STATE_HALF_ATTACHED_ATTACH_SENT;
      goto LAB_001114c7;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x50e;
    if (p_Var2 == (LOGGER_LOG)0x0) goto LAB_001114c9;
    iVar4 = 0x50d;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c",
            "link_detach",iVar4,1,"Sending detach frame failed");
LAB_001114c9:
  if (error != (ERROR_HANDLE)0x0) {
    error_destroy(error);
  }
  return iVar1;
}

Assistant:

int link_detach(LINK_HANDLE link, bool close, const char* error_condition, const char* error_description, AMQP_VALUE info)
{
    int result;

    (void)error_condition;
    (void)error_description;
    (void)info;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else if (link->is_closed)
    {
        result = 0;
    }
    else
    {
        ERROR_HANDLE error;

        if (error_condition != NULL)
        {
            error = error_create(error_condition);
            if (error == NULL)
            {
                LogInfo("Cannot create error for detach, detaching without error anyhow");
            }
            else
            {
                if (error_description != NULL)
                {
                    if (error_set_description(error, error_description) != 0)
                    {
                        LogInfo("Cannot set error description on detach error, detaching anyhow");
                    }
                }

                if (info != NULL)
                {
                    if (error_set_info(error, info) != 0)
                    {
                        LogInfo("Cannot set info map on detach error, detaching anyhow");
                    }
                }
            }
        }
        else
        {
            error = NULL;
        }

        switch (link->link_state)
        {
        case LINK_STATE_HALF_ATTACHED_ATTACH_SENT:
        case LINK_STATE_HALF_ATTACHED_ATTACH_RECEIVED:
            /* Sending detach when remote is not yet attached */
            if (send_detach(link, close, error) != 0)
            {
                LogError("Sending detach frame failed");
                result = MU_FAILURE;
            }
            else
            {
                set_link_state(link, LINK_STATE_DETACHED);
                result = 0;
            }
            break;

        case LINK_STATE_ATTACHED:
            /* Send detach and wait for remote to respond */
            if (send_detach(link, close, error) != 0)
            {
                LogError("Sending detach frame failed");
                result = MU_FAILURE;
            }
            else
            {
                set_link_state(link, LINK_STATE_HALF_ATTACHED_ATTACH_SENT);
                result = 0;
            }
            break;

        case LINK_STATE_DETACHED:
            /* Already detached */
            result = 0;
            break;

        default:
        case LINK_STATE_ERROR:
            /* Already detached and in error state */
            result = MU_FAILURE;
            break;
        }

        if (error != NULL)
        {
            error_destroy(error);
        }
    }

    return result;
}